

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

size_t mbedtls_mpi_bitlen(mbedtls_mpi *X)

{
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  
  sVar2 = X->n;
  if (X->n == 0) {
    return 0;
  }
  do {
    if (sVar2 == 1) {
      sVar1 = 0;
      break;
    }
    sVar1 = sVar2 - 1;
    lVar5 = sVar2 - 1;
    sVar2 = sVar1;
  } while (X->p[lVar5] == 0);
  if ((long)X->p[sVar1] < 0) {
    lVar5 = 0;
  }
  else {
    uVar6 = 0x8000000000000000;
    uVar3 = 0;
    do {
      uVar4 = uVar3 + 1;
      if (0x3e < uVar3) break;
      uVar6 = uVar6 >> 1;
      uVar3 = uVar4;
    } while ((uVar6 & X->p[sVar1]) == 0);
    lVar5 = -uVar4;
  }
  return sVar1 * 0x40 + lVar5 + 0x40;
}

Assistant:

size_t mbedtls_mpi_bitlen( const mbedtls_mpi *X )
{
    size_t i, j;

    if( X->n == 0 )
        return( 0 );

    for( i = X->n - 1; i > 0; i-- )
        if( X->p[i] != 0 )
            break;

    j = biL - mbedtls_clz( X->p[i] );

    return( ( i * biL ) + j );
}